

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptProxy::HasPropertyQuery
          (JavascriptProxy *this,PropertyId propertyId,PropertyValueInfo *info)

{
  BOOL val;
  PropertyQueryFlags PVar1;
  anon_class_8_1_66460f8e getPropertyId;
  anon_class_8_1_66460f8e fn;
  PropertyValueInfo *info_local;
  JavascriptProxy *pJStack_10;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  
  info_local._4_4_ = propertyId;
  pJStack_10 = this;
  if (info != (PropertyValueInfo *)0x0) {
    PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
    PropertyValueInfo::DisablePrototypeCache(info,(RecyclableObject *)this);
  }
  val = HasPropertyTrap<Js::JavascriptProxy::HasPropertyQuery(int,Js::PropertyValueInfo*)::__0,Js::JavascriptProxy::HasPropertyQuery(int,Js::PropertyValueInfo*)::__1>
                  (this,(PropertyId *)((long)&info_local + 4),(PropertyId *)((long)&info_local + 4))
  ;
  PVar1 = JavascriptConversion::BooleanToPropertyQueryFlags(val);
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptProxy::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (info)
        {
            // Prevent caching. See comment in GetPropertyQuery for more detail.
            PropertyValueInfo::SetNoCache(info, this);
            PropertyValueInfo::DisablePrototypeCache(info, this);
        }
        auto fn = [&](RecyclableObject* object)->BOOL {
            return JavascriptOperators::HasProperty(object, propertyId);
        };
        auto getPropertyId = [&]() ->PropertyId {
            return propertyId;
        };
        return JavascriptConversion::BooleanToPropertyQueryFlags(HasPropertyTrap(fn, getPropertyId));
    }